

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,Skeleton *skel,uint32_t indent,
          bool closing_brace)

{
  undefined8 uVar1;
  bool bVar2;
  ostream *poVar3;
  value_type *pvVar4;
  value_type *pvVar5;
  uint indent_00;
  string *psVar6;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  uint32_t n_03;
  uint32_t indent_01;
  undefined7 in_register_00000081;
  uint32_t in_R9D;
  uint indent_02;
  stringstream ss;
  ListEditQual local_218;
  allocator local_211;
  string local_210;
  uint32_t local_1ec;
  undefined1 local_1e8 [64];
  ostream local_1a8 [376];
  
  indent_01 = (uint32_t)CONCAT71(in_register_00000081,closing_brace);
  local_1ec = indent;
  local_1e8._40_8_ = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 0x30));
  pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)skel & 0xffffffff),n);
  poVar3 = ::std::operator<<(local_1a8,(string *)&local_210);
  to_string_abi_cxx11_((string *)local_1e8,(tinyusdz *)(ulong)*(uint *)(this + 0xc0),s);
  poVar3 = ::std::operator<<(poVar3,(string *)local_1e8);
  poVar3 = ::std::operator<<(poVar3," Skeleton \"");
  poVar3 = ::std::operator<<(poVar3,(string *)(this + 0xa0));
  ::std::operator<<(poVar3,"\"\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  bVar2 = PrimMetas::authored((PrimMetas *)(this + 0x1808));
  n_02 = n_00;
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)skel & 0xffffffff),n_00);
    poVar3 = ::std::operator<<(local_1a8,(string *)&local_210);
    ::std::operator<<(poVar3,"(\n");
    ::std::__cxx11::string::_M_dispose();
    print_prim_metas_abi_cxx11_(&local_210,this + 0x1808,(PrimMeta *)(ulong)((int)skel + 1),indent);
    ::std::operator<<(local_1a8,(string *)&local_210);
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)skel & 0xffffffff),n_01);
    poVar3 = ::std::operator<<(local_1a8,(string *)&local_210);
    ::std::operator<<(poVar3,")\n");
    ::std::__cxx11::string::_M_dispose();
    n_02 = extraout_EDX;
  }
  indent_02 = (int)skel + 1;
  local_1e8._32_8_ = (ulong)skel & 0xffffffff;
  pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)skel & 0xffffffff),n_02);
  poVar3 = ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::operator<<(poVar3,"{\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"bindTransforms",(allocator *)&local_218);
  print_typed_attr<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
            (&local_210,this + 0xd0,
             (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
              *)local_1e8,(string *)(ulong)indent_02,indent_01);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"jointNames",(allocator *)&local_218);
  print_typed_attr<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
            (&local_210,this + 800,
             (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
             local_1e8,(string *)(ulong)indent_02,indent_01);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"joints",(allocator *)&local_218);
  print_typed_attr<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
            (&local_210,this + 0x570,
             (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
             local_1e8,(string *)(ulong)indent_02,indent_01);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"restTransforms",(allocator *)&local_218);
  indent_00 = indent_02;
  print_typed_attr<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
            (&local_210,this + 0x7c0,
             (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
              *)local_1e8,(string *)(ulong)indent_02,indent_01);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  if (this[0xd20] == (tinyusdz)0x1) {
    pvVar4 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                       ((optional<tinyusdz::Relationship> *)(this + 0xd20));
    pvVar5 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                       ((optional<tinyusdz::Relationship> *)(this + 0xd20));
    local_218 = pvVar5->listOpQual;
    psVar6 = (string *)local_1e8;
    ::std::__cxx11::string::string(psVar6,"skel:animationSource",&local_211);
    anon_unknown_173::print_relationship
              (&local_210,pvVar4,&local_218,SUB81(psVar6,0),(string *)(ulong)indent_02,in_R9D);
    indent_00 = (uint)psVar6;
    ::std::operator<<(local_1a8,(string *)&local_210);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  if (this[0xa10] == (tinyusdz)0x1) {
    pvVar4 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                       ((optional<tinyusdz::Relationship> *)(this + 0xa10));
    pvVar5 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                       ((optional<tinyusdz::Relationship> *)(this + 0xa10));
    local_218 = pvVar5->listOpQual;
    psVar6 = (string *)local_1e8;
    ::std::__cxx11::string::string(psVar6,"proxyPrim",&local_211);
    anon_unknown_173::print_relationship
              (&local_210,pvVar4,&local_218,SUB81(psVar6,0),(string *)(ulong)indent_02,in_R9D);
    indent_00 = (uint)psVar6;
    ::std::operator<<(local_1a8,(string *)&local_210);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  print_xformOps_abi_cxx11_
            (&local_210,this,
             (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)(ulong)indent_02,
             indent_00);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"visibility",(allocator *)&local_218);
  print_typed_token_attr<tinyusdz::Visibility>
            (&local_210,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *)
             (this + 0x1030),(string *)local_1e8,indent_02);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"purpose",(allocator *)&local_218);
  print_typed_token_attr<tinyusdz::Purpose>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Purpose> *)(this + 0x1530),
             (string *)local_1e8,indent_02);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"extent",(allocator *)&local_218);
  print_typed_attr<tinyusdz::Extent>
            (&local_210,(TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *)(this + 0x12b8),
             (string *)local_1e8,indent_02);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  print_props(&local_210,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0x17d8),indent_02);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  if ((char)local_1ec != '\0') {
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)local_1e8._32_8_,n_03);
    poVar3 = ::std::operator<<(local_1a8,(string *)&local_210);
    ::std::operator<<(poVar3,"}\n");
    ::std::__cxx11::string::_M_dispose();
  }
  uVar1 = local_1e8._40_8_;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 0x30));
  return (string *)uVar1;
}

Assistant:

std::string to_string(const Skeleton &skel, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(skel.spec) << " Skeleton \""
     << skel.name << "\"\n";
  if (skel.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(skel.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  ss << print_typed_attr(skel.bindTransforms, "bindTransforms", indent + 1);
  ss << print_typed_attr(skel.jointNames, "jointNames", indent + 1);
  ss << print_typed_attr(skel.joints, "joints", indent + 1);
  ss << print_typed_attr(skel.restTransforms, "restTransforms", indent + 1);

  if (skel.animationSource) {
    ss << print_relationship(skel.animationSource.value(),
                             skel.animationSource.value().get_listedit_qual(),
                             /* custom */ false, "skel:animationSource",
                             indent + 1);
  }

  if (skel.proxyPrim) {
    ss << print_relationship(skel.proxyPrim.value(),
                             skel.proxyPrim.value().get_listedit_qual(),
                             /* custom */ false, "proxyPrim", indent + 1);
  }

  ss << print_xformOps(skel.xformOps, indent + 1);

  ss << print_typed_token_attr(skel.visibility, "visibility", indent + 1);
  ss << print_typed_token_attr(skel.purpose, "purpose", indent + 1);
  ss << print_typed_attr(skel.extent, "extent", indent + 1);

  ss << print_props(skel.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}